

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O1

void __thiscall QButtonGroup::removeButton(QButtonGroup *this,QAbstractButton *button)

{
  QButtonGroupPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  QWindow *local_30;
  QWindow *local_28;
  anon_class_8_1_54a39814_for__M_pred local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QButtonGroupPrivate **)&this->field_0x8;
  pDVar1 = (this_00->checkedButton).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = (this_00->checkedButton).wp.value;
  }
  local_30 = (QWindow *)button;
  if (pQVar2 == (QObject *)button) {
    QButtonGroupPrivate::detectCheckedButton(this_00);
  }
  if (*(QButtonGroup **)(*(long *)(local_30 + 8) + 0x290) == this) {
    *(undefined8 *)(*(long *)(local_30 + 8) + 0x290) = 0;
    local_20.t = &local_28;
    local_28 = local_30;
    QtPrivate::
    sequential_erase_if<QList<QAbstractButton*>,QtPrivate::sequential_erase<QList<QAbstractButton*>,QAbstractButton*>(QList<QAbstractButton*>&,QAbstractButton*const&)::_lambda(auto:1_const&)_1_>
              (&this_00->buttonList,&local_20);
    QHash<QAbstractButton*,int>::removeImpl<QAbstractButton*>
              ((QHash<QAbstractButton*,int> *)&this_00->mapping,(QAbstractButton **)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QButtonGroup::removeButton(QAbstractButton *button)
{
    Q_D(QButtonGroup);
    if (d->checkedButton == button) {
        d->detectCheckedButton();
    }
    if (button->d_func()->group == this) {
        button->d_func()->group = nullptr;
        d->buttonList.removeAll(button);
        d->mapping.remove(button);
    }
}